

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O3

void __thiscall
hiberlite::AVisitor<hiberlite::ExtractModel>::pushAndSubPrefix
          (AVisitor<hiberlite::ExtractModel> *this,string *prefix)

{
  string *psVar1;
  int *piVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::deque<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>::push_back
            (&(this->stack).c,&this->scope);
  paVar3 = &local_48.field_2;
  pcVar4 = (this->scope)._prefix._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar4,pcVar4 + (this->scope)._prefix._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar3) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  psVar1 = &(this->scope)._prefix;
  if (local_48._M_string_length == 0) {
    std::__cxx11::string::_M_append((char *)psVar1,(ulong)(prefix->_M_dataplus)._M_p);
  }
  else {
    std::operator+(&local_48,"_",prefix);
    std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar3) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  piVar2 = &(this->scope).prefix_depth;
  *piVar2 = *piVar2 + 1;
  return;
}

Assistant:

void AVisitor<C>::pushAndSubPrefix(std::string prefix)
{
	stack.push(scope);
	if(scope.prefix().size())
		scope._prefix+="_"+prefix;
	else
		scope._prefix+=prefix;
	scope.prefix_depth++;
}